

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

gs_stmt_t * gs_parse_stmt_block(gs_parser_t *parser)

{
  gs_token_t *pgVar1;
  char *__src;
  int iVar2;
  int iVar3;
  gs_stmt_t *pgVar4;
  gs_expr_t **__dest;
  long lVar5;
  bool bVar6;
  bool bVar7;
  vec_gs_stmt_t stmts;
  char *local_48;
  int aiStack_40 [2];
  char *local_38;
  
  local_48 = (char *)0x0;
  aiStack_40[0] = 0;
  aiStack_40[1] = 0;
  local_38 = "script/parser";
  do {
    iVar2 = aiStack_40[0];
    __src = local_48;
    pgVar1 = (parser->tokens).data;
    iVar3 = parser->cur_token;
    bVar6 = pgVar1[iVar3].type == GS_TOKEN_CHAR;
    bVar7 = pgVar1[iVar3].field_3.c == '}';
    if (bVar7 && bVar6) {
      if (iVar3 < (parser->tokens).length) {
        parser->cur_token = iVar3 + 1;
      }
      if (bVar7 && bVar6) {
        lVar5 = (long)aiStack_40[0];
        pgVar4 = (gs_stmt_t *)gs_parser_alloc(parser,0x48);
        pgVar4->type = GS_STMT_BLOCK;
        (pgVar4->field_1).if_stmt.num_conds = iVar2;
        __dest = (gs_expr_t **)gs_parser_alloc(parser,lVar5 << 3);
        (pgVar4->field_1).if_stmt.conds = __dest;
        memcpy(__dest,__src,lVar5 << 3);
        goto LAB_00139ef7;
      }
    }
    pgVar4 = gs_parse_stmt(parser);
    if (parser->error != false) {
      pgVar4 = (gs_stmt_t *)0x0;
LAB_00139ef7:
      golf_free_tracked(local_48);
      return pgVar4;
    }
    iVar3 = vec_expand_(&local_48,aiStack_40,aiStack_40 + 1,8,local_38);
    if (iVar3 == 0) {
      lVar5 = (long)aiStack_40[0];
      aiStack_40[0] = aiStack_40[0] + 1;
      *(gs_stmt_t **)(local_48 + lVar5 * 8) = pgVar4;
    }
  } while( true );
}

Assistant:

static gs_stmt_t *gs_parse_stmt_block(gs_parser_t *parser) {
    vec_gs_stmt_t stmts;
    vec_init(&stmts, "script/parser");

    gs_token_t token = gs_peek(parser);
    gs_stmt_t *stmt = NULL;

    while (!gs_eat_char(parser, '}')) {
        gs_stmt_t *stmt = gs_parse_stmt(parser);
        if (parser->error) goto cleanup;

        vec_push(&stmts, stmt);
    }

    stmt = gs_stmt_block_new(parser, token, stmts);

cleanup:
    vec_deinit(&stmts);
    return stmt;
}